

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

SoapySDRRange *
SoapySDRDevice_getFrequencyRangeComponent
          (SoapySDRDevice *device,int direction,size_t channel,char *name,size_t *length)

{
  undefined1 *puVar1;
  SoapySDRRange *pSVar2;
  allocator local_61;
  _Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> local_60;
  string local_48 [32];
  
  *length = 0;
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string(local_48,name,&local_61);
  (**(code **)(*(long *)device + 0x1e8))(&local_60,device,direction,channel,local_48);
  pSVar2 = toRangeList((RangeList *)&local_60,length);
  std::_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~_Vector_base(&local_60);
  std::__cxx11::string::~string(local_48);
  return pSVar2;
}

Assistant:

SoapySDRRange *SoapySDRDevice_getFrequencyRangeComponent(const SoapySDRDevice *device, const int direction, const size_t channel, const char *name, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toRangeList(device->getFrequencyRange(direction, channel, name), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}